

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O1

result_type __thiscall
pstore::serialize::archive::details::database_writer_policy::
putn<pstore::gsl::span<unsigned_char_const,_1l>>
          (database_writer_policy *this,span<const_unsigned_char,__1L> sp)

{
  element_type *__result;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  pair<std::shared_ptr<unsigned_char>,_pstore::typed_address<unsigned_char>_> local_78;
  span<const_unsigned_char,__1L> local_60;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_50;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_40;
  
  local_60.storage_.data_ = sp.storage_.data_;
  local_60.storage_.super_extent_type<_1L> = sp.storage_.super_extent_type<_1L>.size_;
  if (local_60.storage_.super_extent_type<_1L>.size_ < 0) {
    assert_failed("t >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/archive.hpp"
                  ,0x78);
  }
  transaction_base::alloc_rw<unsigned_char,void>
            (&local_78,this->transaction_,local_60.storage_.super_extent_type<_1L>.size_);
  this_00._M_pi =
       local_78.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  __result = local_78.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::span_iterator
            (&local_40,&local_60,0);
  gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::span_iterator
            (&local_50,&local_60,local_60.storage_.super_extent_type<_1L>.size_);
  std::
  copy<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char_const,_1l>,false>,unsigned_char*>
            (&local_40,&local_50,__result);
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  return (result_type)(value_type)local_78.second.a_.a_;
}

Assistant:

auto putn (Span sp) -> result_type {
                        using element_type =
                            typename std::remove_const<typename Span::element_type>::type;

                        std::shared_ptr<element_type> ptr;
                        auto addr = typed_address<element_type>::null ();
                        std::tie (ptr, addr) = transaction_.template alloc_rw<element_type> (
                            unsigned_cast (sp.size ()));
                        std::copy (std::begin (sp), std::end (sp), ptr.get ());
                        return addr.to_address ();
                    }